

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposer.h
# Opt level: O0

GeneratedProposal * __thiscall
FixedDegreeProposer::generate_proposal
          (GeneratedProposal *__return_storage_ptr__,FixedDegreeProposer *this,Network *network)

{
  GeneratedProposal *result;
  Link local_50;
  Link local_48;
  Link local_40;
  Link local_38;
  Link local_30;
  Link local_28;
  Link local_20;
  Network *local_18;
  Network *network_local;
  FixedDegreeProposer *this_local;
  
  local_18 = network;
  network_local = (Network *)this;
  GeneratedProposal::GeneratedProposal(__return_storage_ptr__);
  local_20 = random_old_link(this,local_18);
  std::pair<unsigned_int,_unsigned_int>::operator=(&__return_storage_ptr__->old_link1,&local_20);
  local_30 = __return_storage_ptr__->old_link1;
  local_28 = random_new_link(this,local_18,local_30);
  std::pair<unsigned_int,_unsigned_int>::operator=(&__return_storage_ptr__->new_link1,&local_28);
  local_40 = __return_storage_ptr__->new_link1;
  local_48 = __return_storage_ptr__->old_link1;
  local_38 = old_link(this,local_18,local_40,local_48);
  std::pair<unsigned_int,_unsigned_int>::operator=(&__return_storage_ptr__->old_link2,&local_38);
  local_50 = new_link(this,__return_storage_ptr__->old_link1,__return_storage_ptr__->old_link2);
  std::pair<unsigned_int,_unsigned_int>::operator=(&__return_storage_ptr__->new_link2,&local_50);
  return __return_storage_ptr__;
}

Assistant:

GeneratedProposal generate_proposal(Network const& network) const {
        GeneratedProposal result;

        result.old_link1 = random_old_link(network);
        result.new_link1 = random_new_link(network, result.old_link1);
        result.old_link2 = old_link(network, result.new_link1, result.old_link1);
        result.new_link2 = new_link(result.old_link1, result.old_link2);

        return result;
    }